

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

IdentPtr __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::GetSecondaryBufferAsPid
          (Scanner<UTF8EncodingPolicyBase<false>_> *this)

{
  HashTbl *this_00;
  bool createPid;
  Scanner<UTF8EncodingPolicyBase<false>_> *this_local;
  
  if (((byte)this->field_0x508 >> 6 & 1) == 0) {
    this_00 = GetHashTbl(this);
    this_local = (Scanner<UTF8EncodingPolicyBase<false>_> *)
                 HashTbl::PidHashNameLen<char16_t>
                           (this_00,(this->m_tempChBufSecondary).m_prgch,
                            (this->m_tempChBufSecondary).m_ichCur);
  }
  else {
    this_local = (Scanner<UTF8EncodingPolicyBase<false>_> *)0x0;
  }
  return (IdentPtr)this_local;
}

Assistant:

IdentPtr Scanner<EncodingPolicy>::GetSecondaryBufferAsPid()
{
    bool createPid = true;

    if ((m_DeferredParseFlags & ScanFlagSuppressStrPid) != 0)
    {
        createPid = false;
    }

    if (createPid)
    {
        return this->GetHashTbl()->PidHashNameLen(m_tempChBufSecondary.m_prgch, m_tempChBufSecondary.m_ichCur);
    }
    else
    {
        return nullptr;
    }
}